

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int ly_set_contains(ly_set *set,void *node)

{
  long lVar1;
  
  if ((set != (ly_set *)0x0) && (set->number != 0)) {
    lVar1 = 0;
    do {
      if ((set->set).s[lVar1] == (lys_node *)node) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (set->number != (uint)lVar1);
  }
  return -1;
}

Assistant:

API int
ly_set_contains(const struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            /* object found */
            return i;
        }
    }

    /* object not found */
    return -1;
}